

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall TasgridWrapper::setHierarchy(TasgridWrapper *this)

{
  string *filename;
  size_t sVar1;
  char cVar2;
  int iVar3;
  int __val;
  int iVar4;
  unsigned_long uVar5;
  Data2D<double> vals;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Data2D<double> local_50;
  
  filename = &this->valsfilename;
  readMatrix(&local_50,this,filename);
  iVar4 = (int)local_50.num_strips;
  iVar3 = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"grid is awaiting ",&local_159);
  __val = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  std::__cxx11::to_string(&local_110,__val);
  std::operator+(&local_d0,&local_f0,&local_110);
  std::operator+(&local_b0,&local_d0," hierarchical surpluses, but ");
  std::operator+(&local_90,&local_b0,filename);
  std::operator+(&local_70,&local_90," specifies ");
  std::__cxx11::to_string(&local_130,(int)local_50.num_strips);
  std::operator+(&local_158,&local_70,&local_130);
  iassert(this,iVar3 == iVar4,local_158._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  if (*(long **)&this->field_0x8 == (long *)0x0) {
LAB_0012db65:
    uVar5 = 0;
  }
  else {
    cVar2 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
    sVar1 = local_50.stride;
    if (cVar2 != '\0') {
      if (*(long *)&this->field_0x8 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (long)*(int *)(*(long *)&this->field_0x8 + 0x14) * 2;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"fourier grid is set for ",&local_159);
      if (*(long *)&this->field_0x8 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *(int *)(*(long *)&this->field_0x8 + 0x14);
      }
      std::__cxx11::to_string(&local_110,iVar4);
      std::operator+(&local_d0,&local_f0,&local_110);
      std::operator+(&local_b0,&local_d0," outputs, but ");
      std::operator+(&local_90,&local_b0,filename);
      std::operator+(&local_70,&local_90," specifies ");
      std::__cxx11::to_string(&local_130,local_50.stride);
      std::operator+(&local_158,&local_70,&local_130);
      iassert(this,sVar1 == uVar5,local_158._M_dataplus._M_p);
      goto LAB_0012dd24;
    }
    if (*(long *)&this->field_0x8 == 0) goto LAB_0012db65;
    uVar5 = (unsigned_long)*(int *)(*(long *)&this->field_0x8 + 0x14);
  }
  sVar1 = local_50.stride;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"grid is set for ",&local_159);
  if (*(long *)&this->field_0x8 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *(int *)(*(long *)&this->field_0x8 + 0x14);
  }
  std::__cxx11::to_string(&local_110,iVar4);
  std::operator+(&local_d0,&local_f0,&local_110);
  std::operator+(&local_b0,&local_d0," outputs, but ");
  std::operator+(&local_90,&local_b0,filename);
  std::operator+(&local_70,&local_90," specifies ");
  std::__cxx11::to_string(&local_130,local_50.stride);
  std::operator+(&local_158,&local_70,&local_130);
  iassert(this,sVar1 == uVar5,local_158._M_dataplus._M_p);
LAB_0012dd24:
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  if (this->pass_flag == true) {
    local_158._M_dataplus._M_p =
         (pointer)local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_158._M_string_length =
         (size_type)
         local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_158.field_2._M_allocated_capacity =
         (size_type)
         local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_50.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::setHierarchicalCoefficients((vector *)this);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_158);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_50.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TasgridWrapper::setHierarchy(){
    auto vals = readMatrix(valsfilename);
    iassert(vals.getNumStrips() == grid.getNumPoints(),
            (std::string("grid is awaiting ") + std::to_string(grid.getNumPoints()) + " hierarchical surpluses, but "
             + valsfilename + " specifies " + std::to_string(vals.getNumStrips())).c_str());
    if (grid.isFourier())
        iassert((vals.getStride() == (size_t) (2 * grid.getNumOutputs())),
                (std::string("fourier grid is set for ") + std::to_string(grid.getNumOutputs()) + " outputs, but "
                 + valsfilename + " specifies " + std::to_string(vals.getStride())).c_str());
    else
        iassert((vals.getStride() == (size_t) grid.getNumOutputs()),
                (std::string("grid is set for ") + std::to_string(grid.getNumOutputs()) + " outputs, but "
                 + valsfilename + " specifies " + std::to_string(vals.getStride())).c_str());
    if (not pass_flag) return;
    grid.setHierarchicalCoefficients(vals.release());
}